

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void uiter_setUTF8_63(UCharIterator *iter,char *s,int32_t length)

{
  size_t sVar1;
  int32_t local_20;
  int32_t length_local;
  char *s_local;
  UCharIterator *iter_local;
  
  if (iter != (UCharIterator *)0x0) {
    if ((s == (char *)0x0) || (length < -1)) {
      memcpy(iter,&noopIterator,0x70);
    }
    else {
      memcpy(iter,&utf8Iterator,0x70);
      iter->context = s;
      if (length < 0) {
        sVar1 = strlen(s);
        iter->limit = (int32_t)sVar1;
      }
      else {
        iter->limit = length;
      }
      if (iter->limit < 2) {
        local_20 = iter->limit;
      }
      else {
        local_20 = -1;
      }
      iter->length = local_20;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setUTF8(UCharIterator *iter, const char *s, int32_t length) {
    if(iter!=0) {
        if(s!=0 && length>=-1) {
            *iter=utf8Iterator;
            iter->context=s;
            if(length>=0) {
                iter->limit=length;
            } else {
                iter->limit=(int32_t)uprv_strlen(s);
            }
            iter->length= iter->limit<=1 ? iter->limit : -1;
        } else {
            *iter=noopIterator;
        }
    }
}